

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall enact::Lexer::identifier(Token *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  TokenType type;
  string sStack_38;
  
  while (((bVar1 = (this->m_source)._M_dataplus._M_p[this->m_current], (byte)(bVar1 - 0x30) < 10 ||
          (bVar1 == 0x5f)) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))) {
    advance(this);
  }
  std::__cxx11::string::substr((ulong)&sStack_38,(ulong)this);
  type = getIdentifierType(this,&sStack_38);
  makeToken(__return_storage_ptr__,this,type);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::identifier() {
        while (isIdentifier(peek())) advance();
        return makeToken(getIdentifierType(m_source.substr(m_start, m_current - m_start)));
    }